

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::BeginGreedyLoopNoBacktrackInst::Exec
          (BeginGreedyLoopNoBacktrackInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  LoopInfo *pLVar1;
  ResumeCont *this_00;
  LoopInfo *loopInfo;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  BeginGreedyLoopNoBacktrackInst *this_local;
  
  pLVar1 = Matcher::LoopIdToLoopInfo(matcher,(this->super_GreedyLoopNoBacktrackMixin).loopId);
  pLVar1->number = 0;
  pLVar1->startInputOffset = *inputOffset;
  this_00 = (ResumeCont *)
            ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
            Push<UnifiedRegex::ResumeCont>
                      (&contStack->
                        super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
  ResumeCont::ResumeCont(this_00,*inputOffset,(this->super_GreedyLoopNoBacktrackMixin).exitLabel);
  *instPointer = *instPointer + 9;
  Matcher::PushStats(matcher,contStack,input);
  return false;
}

Assistant:

inline bool BeginGreedyLoopNoBacktrackInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        // CHOICEPOINT: Try one iteration of body, if backtrack continue from here with no iterations
        PUSH(contStack, ResumeCont, inputOffset, exitLabel);
        instPointer += sizeof(*this);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.PushStats(contStack, input);
#endif

        return false;
    }